

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_avx2.h
# Opt level: O0

void btf_32_avx2_type0(int32_t w0,int32_t w1,__m256i *in0,__m256i *in1,__m256i _r,int32_t cos_bit)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  uint in_ESI;
  uint in_EDI;
  uint in_R8D;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar9 [16];
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined1 auVar10 [16];
  __m256i temp1;
  __m256i in1_w0;
  __m256i in0_w1;
  __m256i temp0;
  __m256i in1_w1;
  __m256i in0_w0;
  __m256i ww1;
  __m256i ww0;
  __m256i _in1;
  __m256i _in0;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  
  auVar5 = *in_RDX;
  auVar8 = *in_RCX;
  auVar1 = vpinsrd_avx(ZEXT416(in_EDI),in_EDI,1);
  auVar1 = vpinsrd_avx(auVar1,in_EDI,2);
  auVar1 = vpinsrd_avx(auVar1,in_EDI,3);
  auVar10 = vpinsrd_avx(ZEXT416(in_EDI),in_EDI,1);
  auVar10 = vpinsrd_avx(auVar10,in_EDI,2);
  auVar10 = vpinsrd_avx(auVar10,in_EDI,3);
  uStack_330 = auVar10._0_8_;
  uStack_328 = auVar10._8_8_;
  auVar10 = vpinsrd_avx(ZEXT416(in_ESI),in_ESI,1);
  auVar10 = vpinsrd_avx(auVar10,in_ESI,2);
  auVar10 = vpinsrd_avx(auVar10,in_ESI,3);
  auVar9 = vpinsrd_avx(ZEXT416(in_ESI),in_ESI,1);
  auVar9 = vpinsrd_avx(auVar9,in_ESI,2);
  auVar9 = vpinsrd_avx(auVar9,in_ESI,3);
  auVar9 = ZEXT116(0) * auVar10 + ZEXT116(1) * auVar9;
  auVar10 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar10;
  uStack_2f0 = auVar10._0_8_;
  uStack_2e8 = auVar10._8_8_;
  auVar7._16_8_ = uStack_330;
  auVar7._0_16_ = auVar1;
  auVar7._24_8_ = uStack_328;
  auVar2 = vpmulld_avx2(*in_RDX,auVar7);
  auVar6._16_8_ = uStack_2f0;
  auVar6._0_16_ = auVar9;
  auVar6._24_8_ = uStack_2e8;
  auVar3 = vpmulld_avx2(*in_RCX,auVar6);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar4._16_8_ = in_YMM0_H;
  auVar4._24_8_ = in_register_00001218;
  auVar2 = vpaddd_avx2(auVar2,auVar4);
  auVar2 = vpsrad_avx2(auVar2,ZEXT416(in_R8D));
  *in_RDX = auVar2;
  auVar2._16_8_ = uStack_2f0;
  auVar2._0_16_ = auVar9;
  auVar2._24_8_ = uStack_2e8;
  auVar2 = vpmulld_avx2(auVar5,auVar2);
  auVar5._16_8_ = uStack_330;
  auVar5._0_16_ = auVar1;
  auVar5._24_8_ = uStack_328;
  auVar3 = vpmulld_avx2(auVar8,auVar5);
  auVar2 = vpsubd_avx2(auVar2,auVar3);
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar3._16_8_ = in_YMM0_H;
  auVar3._24_8_ = in_register_00001218;
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar2 = vpsrad_avx2(auVar2,ZEXT416(in_R8D));
  *in_RCX = auVar2;
  return;
}

Assistant:

static inline void btf_32_avx2_type0(const int32_t w0, const int32_t w1,
                                     __m256i *in0, __m256i *in1,
                                     const __m256i _r, const int32_t cos_bit) {
  __m256i _in0 = *in0;
  __m256i _in1 = *in1;
  const __m256i ww0 = _mm256_set1_epi32(w0);
  const __m256i ww1 = _mm256_set1_epi32(w1);
  const __m256i in0_w0 = _mm256_mullo_epi32(_in0, ww0);
  const __m256i in1_w1 = _mm256_mullo_epi32(_in1, ww1);
  __m256i temp0 = _mm256_add_epi32(in0_w0, in1_w1);
  temp0 = _mm256_add_epi32(temp0, _r);
  *in0 = _mm256_srai_epi32(temp0, cos_bit);
  const __m256i in0_w1 = _mm256_mullo_epi32(_in0, ww1);
  const __m256i in1_w0 = _mm256_mullo_epi32(_in1, ww0);
  __m256i temp1 = _mm256_sub_epi32(in0_w1, in1_w0);
  temp1 = _mm256_add_epi32(temp1, _r);
  *in1 = _mm256_srai_epi32(temp1, cos_bit);
}